

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_asof_join.cpp
# Opt level: O1

PhysicalOperator * __thiscall
duckdb::PhysicalPlanGenerator::PlanAsOfJoin(PhysicalPlanGenerator *this,LogicalComparisonJoin *op)

{
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *this_00;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  vector<unsigned_long,_true> *this_01;
  ExpressionType EVar2;
  pointer pLVar3;
  pointer pLVar4;
  iterator iVar5;
  iterator __position;
  undefined8 uVar6;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> _Var7;
  LogicalComparisonJoin *args;
  int iVar8;
  reference pvVar9;
  pointer pLVar10;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  type pLVar11;
  reference pvVar12;
  ClientConfig *pCVar13;
  pointer pEVar14;
  pointer pBVar15;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var16;
  PhysicalOperator *args_2;
  BoundReferenceExpression *this_02;
  pointer pPVar17;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var18;
  InternalException *pIVar19;
  undefined1 *__n;
  unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true> *this_03;
  size_type *psVar20;
  size_type sVar21;
  size_type sVar22;
  templated_unique_single_t asof_end;
  optional_ptr<duckdb::PhysicalOperator,_true> result;
  JoinCondition asof_upper;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  window_select;
  vector<unsigned_long,_true> equi_indexes;
  idx_t lhs_cardinality;
  LogicalType asof_type;
  idx_t rhs_cardinality;
  _Head_base<0UL,_duckdb::BoundWindowExpression_*,_false> local_150;
  Value local_148;
  PhysicalOperator *local_108;
  vector<duckdb::JoinCondition,_true> *local_100;
  _Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> local_f8;
  BoundReferenceExpression *pBStack_f0;
  char local_e8;
  PhysicalPlanGenerator *local_e0;
  reference local_d8;
  PhysicalOperator *local_d0;
  Value local_c8;
  size_type *local_88;
  iterator iStack_80;
  unsigned_long *local_78;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  *local_70;
  ulong local_68;
  LogicalType local_60;
  LogicalComparisonJoin *local_48;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_40;
  unsigned_long local_38;
  
  this_00 = &(op->super_LogicalJoin).super_LogicalOperator.children;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(pvVar9);
  iVar8 = (*pLVar10->_vptr_LogicalOperator[7])(pLVar10,this->context);
  local_68 = CONCAT44(extraout_var,iVar8);
  pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator->(pvVar9);
  iVar8 = (*pLVar10->_vptr_LogicalOperator[7])(pLVar10);
  local_38 = CONCAT44(extraout_var_00,iVar8);
  pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,0);
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar9);
  local_d0 = CreatePlan(this,pLVar11);
  local_70 = this_00;
  pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
           ::operator[](this_00,1);
  pLVar11 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
            ::operator*(pvVar9);
  local_e0 = this;
  local_108 = CreatePlan(this,pLVar11);
  local_78 = (unsigned_long *)0x0;
  local_88 = (size_type *)0x0;
  iStack_80._M_current = (size_type *)0x0;
  local_100 = &op->conditions;
  sVar21 = ((long)(op->conditions).
                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(op->conditions).
                  super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                  super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_c8.type_.id_ = INVALID;
  local_c8.type_.physical_type_ = ~INVALID;
  local_c8.type_._2_6_ = 0;
  if ((op->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (op->conditions).super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>.
      super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sVar22 = sVar21;
    do {
      pvVar12 = vector<duckdb::JoinCondition,_true>::operator[](local_100,local_c8.type_._0_8_);
      EVar2 = pvVar12->comparison;
      sVar21 = local_c8.type_._0_8_;
      if (3 < EVar2 - 0x1b) {
        if ((EVar2 != COMPARE_BOUNDARY_START) && (EVar2 != COMPARE_BOUNDARY_END)) {
          pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
          local_148.type_._0_8_ =
               &local_148.type_.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_148,"Invalid ASOF JOIN comparison","");
          InternalException::InternalException(pIVar19,(string *)&local_148);
          __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
        }
        sVar21 = sVar22;
        if (iStack_80._M_current == local_78) {
          ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
          _M_realloc_insert<unsigned_long&>
                    ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_88,iStack_80,
                     (unsigned_long *)&local_c8);
        }
        else {
          *iStack_80._M_current = local_c8.type_._0_8_;
          iStack_80._M_current = iStack_80._M_current + 1;
        }
      }
      local_c8.type_._0_8_ = local_c8.type_._0_8_ + 1;
      sVar22 = sVar21;
    } while ((ulong)local_c8.type_._0_8_ <
             (ulong)(((long)(op->conditions).
                            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            .
                            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(op->conditions).
                            super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            .
                            super__Vector_base<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555));
  }
  pCVar13 = ClientConfig::GetConfig(local_e0->context);
  if (pCVar13->force_asof_iejoin == false) {
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](local_70,0);
    pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(pvVar9);
    if (((pLVar10->has_estimated_cardinality == true) &&
        (local_68 <= pCVar13->asof_loop_join_threshold)) &&
       (local_148.type_._0_8_ = PlanAsOfLoopJoin(local_e0,op,local_d0,local_108),
       (PhysicalOperator *)local_148.type_._0_8_ != (PhysicalOperator *)0x0)) {
      optional_ptr<duckdb::PhysicalOperator,_true>::CheckValid
                ((optional_ptr<duckdb::PhysicalOperator,_true> *)&local_148);
      _Var18._M_head_impl = (Expression *)local_148.type_._0_8_;
    }
    else {
      pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
                operator->(&local_e0->physical_plan);
      _Var18._M_head_impl =
           (Expression *)
           PhysicalPlan::
           Make<duckdb::PhysicalAsOfJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&>
                     (pPVar17,op,local_d0,local_108);
    }
  }
  else {
    if ((op->super_LogicalJoin).right_projection_map.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (op->super_LogicalJoin).right_projection_map.
        super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      this_01 = &(op->super_LogicalJoin).right_projection_map;
      pLVar3 = (local_108->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_start;
      pLVar4 = (local_108->types).
               super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
               super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl
               .super__Vector_impl_data._M_finish;
      __n = (undefined1 *)(((long)pLVar4 - (long)pLVar3 >> 3) * -0x5555555555555555);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_01,(size_type)__n);
      local_148.type_._0_8_ =
           (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
      if (pLVar4 != pLVar3) {
        do {
          iVar5._M_current =
               (op->super_LogicalJoin).right_projection_map.
               super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
          if (iVar5._M_current ==
              (op->super_LogicalJoin).right_projection_map.
              super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
            _M_realloc_insert<unsigned_long&>
                      ((vector<unsigned_long,std::allocator<unsigned_long>> *)this_01,iVar5,
                       (unsigned_long *)&local_148);
          }
          else {
            *iVar5._M_current = local_148.type_._0_8_;
            (op->super_LogicalJoin).right_projection_map.
            super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish = iVar5._M_current + 1;
          }
          local_148.type_._0_8_ =
               (long)&((BaseExpression *)local_148.type_._0_8_)->_vptr_BaseExpression + 1;
        } while ((ulong)local_148.type_._0_8_ < __n);
      }
    }
    local_d8 = vector<duckdb::JoinCondition,_true>::operator[](local_100,sVar21);
    puVar1 = &local_d8->right;
    pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar1);
    LogicalType::LogicalType(&local_60,&pEVar14->return_type);
    local_f8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = 0x84;
    local_148.type_._0_8_ =
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    local_c8.type_.id_ = INVALID;
    local_c8.type_.physical_type_ = ~INVALID;
    local_c8.type_._2_6_ = 0;
    make_uniq<duckdb::BoundWindowExpression,duckdb::ExpressionType,duckdb::LogicalType&,decltype(nullptr),decltype(nullptr)>
              ((ExpressionType *)&local_150,(LogicalType *)&local_f8,(void **)&local_60,
               (void **)&local_148);
    pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_150);
    pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(puVar1);
    (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])
              ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
               &local_148,pEVar14);
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&pBVar15->children,
               (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               &local_148);
    if ((Expression *)local_148.type_._0_8_ != (Expression *)0x0) {
      (*((BaseExpression *)local_148.type_._0_8_)->_vptr_BaseExpression[1])();
    }
    Value::BIGINT(&local_c8,1);
    _Var16._M_head_impl = (Expression *)operator_new(0x98);
    Value::Value(&local_148,&local_c8);
    BoundConstantExpression::BoundConstantExpression
              ((BoundConstantExpression *)_Var16._M_head_impl,&local_148);
    local_40 = puVar1;
    Value::~Value(&local_148);
    pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_150);
    _Var18._M_head_impl =
         (pBVar15->offset_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar15->offset_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var16._M_head_impl;
    local_48 = op;
    if (_Var18._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var18._M_head_impl)->super_BaseExpression + 8))();
    }
    Value::~Value(&local_c8);
    iVar5._M_current = iStack_80._M_current;
    if (local_88 != iStack_80._M_current) {
      psVar20 = local_88;
      do {
        sVar21 = *psVar20;
        pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                  ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                                *)&local_150);
        pvVar12 = vector<duckdb::JoinCondition,_true>::operator[](local_100,sVar21);
        pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                  operator->(&pvVar12->right);
        (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])
                  ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                   &local_148,pEVar14);
        ::std::
        vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
        ::
        emplace_back<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                  ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                    *)&pBVar15->partitions,
                   (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                   &local_148);
        if ((Expression *)local_148.type_._0_8_ != (Expression *)0x0) {
          (*((BaseExpression *)local_148.type_._0_8_)->_vptr_BaseExpression[1])();
        }
        psVar20 = psVar20 + 1;
      } while (psVar20 != iVar5._M_current);
    }
    puVar1 = local_40;
    args = local_48;
    switch(local_d8->comparison) {
    case COMPARE_LESSTHAN:
    case COMPARE_LESSTHANOREQUALTO:
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_150);
      local_c8.type_.id_ = ANY;
      local_f8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = UNKNOWN;
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar1);
      (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                 &local_148,pEVar14);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar15->orders,(OrderType *)&local_c8,(OrderByNullType *)&local_f8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_148);
      if ((Expression *)local_148.type_._0_8_ != (Expression *)0x0) {
        (*((BaseExpression *)local_148.type_._0_8_)->_vptr_BaseExpression[1])();
      }
      Value::NegativeInfinity(&local_c8,&local_60);
      _Var18._M_head_impl = (Expression *)operator_new(0x98);
      Value::Value(&local_148,&local_c8);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)_Var18._M_head_impl,&local_148);
      Value::~Value(&local_148);
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_150);
      break;
    case COMPARE_GREATERTHAN:
    case COMPARE_GREATERTHANOREQUALTO:
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_150);
      local_c8.type_.id_ = UNKNOWN;
      local_f8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl._0_1_ = UNKNOWN;
      pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                operator->(puVar1);
      (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])
                ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
                 &local_148,pEVar14);
      ::std::vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>>::
      emplace_back<duckdb::OrderType,duckdb::OrderByNullType,duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>
                ((vector<duckdb::BoundOrderByNode,std::allocator<duckdb::BoundOrderByNode>> *)
                 &pBVar15->orders,(OrderType *)&local_c8,(OrderByNullType *)&local_f8,
                 (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 &local_148);
      if ((Expression *)local_148.type_._0_8_ != (Expression *)0x0) {
        (*((BaseExpression *)local_148.type_._0_8_)->_vptr_BaseExpression[1])();
      }
      Value::Infinity(&local_c8,&local_60);
      _Var18._M_head_impl = (Expression *)operator_new(0x98);
      Value::Value(&local_148,&local_c8);
      BoundConstantExpression::BoundConstantExpression
                ((BoundConstantExpression *)_Var18._M_head_impl,&local_148);
      Value::~Value(&local_148);
      pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                              *)&local_150);
      break;
    default:
      pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
      local_148.type_._0_8_ =
           &local_148.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Invalid ASOF JOIN ordering for WINDOW","");
      InternalException::InternalException(pIVar19,(string *)&local_148);
      __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    _Var16._M_head_impl =
         (pBVar15->default_expr).
         super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    (pBVar15->default_expr).
    super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
    super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = _Var18._M_head_impl;
    if (_Var16._M_head_impl != (Expression *)0x0) {
      (**(code **)(*(long *)&(_Var16._M_head_impl)->super_BaseExpression + 8))();
    }
    Value::~Value(&local_c8);
    pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_150);
    pBVar15->start = UNBOUNDED_PRECEDING;
    pBVar15 = unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
              ::operator->((unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                            *)&local_150);
    pBVar15->end = CURRENT_ROW_ROWS;
    local_c8.type_.id_ = INVALID;
    local_c8.type_.physical_type_ = ~INVALID;
    local_c8.type_._2_6_ = 0;
    local_c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_c8.type_.type_info_.internal.
    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::BoundWindowExpression,std::default_delete<duckdb::BoundWindowExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,std::allocator<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>>>
                *)&local_c8,
               (unique_ptr<duckdb::BoundWindowExpression,_std::default_delete<duckdb::BoundWindowExpression>,_true>
                *)&local_150);
    pvVar9 = vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
             ::operator[](local_70,1);
    pLVar10 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
              ::operator->(pvVar9);
    ::std::vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>>::
    emplace_back<duckdb::LogicalType&>
              ((vector<duckdb::LogicalType,std::allocator<duckdb::LogicalType>> *)&pLVar10->types,
               &local_60);
    this_03 = &local_e0->physical_plan;
    pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->(this_03);
    args_2 = PhysicalPlan::
             Make<duckdb::PhysicalWindow,duckdb::vector<duckdb::LogicalType,true>&,duckdb::vector<duckdb::unique_ptr<duckdb::Expression,std::default_delete<duckdb::Expression>,true>,true>,unsigned_long&>
                       (pPVar17,&pLVar10->types,
                        (vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
                         *)&local_c8,&local_38);
    __position._M_current =
         (args_2->children).
         super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         .
         super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (args_2->children).
        super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        .
        super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      ::std::
      vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
      ::_M_realloc_insert<duckdb::PhysicalOperator&>
                ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>>>
                  *)&args_2->children,__position,local_108);
    }
    else {
      (__position._M_current)->_M_data = local_108;
      (args_2->children).
      super_vector<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      .
      super__Vector_base<std::reference_wrapper<duckdb::PhysicalOperator>,_std::allocator<std::reference_wrapper<duckdb::PhysicalOperator>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_f8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Expression_*,_false>)(Expression *)0x0;
    pBStack_f0 = (BoundReferenceExpression *)0x0;
    pEVar14 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
              operator->(&local_d8->left);
    (*(pEVar14->super_BaseExpression)._vptr_BaseExpression[0x11])
              ((__uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> *)
               &local_148,pEVar14);
    _Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         local_f8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
    local_f8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Expression_*,_false>)
         (_Head_base<0UL,_duckdb::Expression_*,_false>)local_148.type_._0_8_;
    local_148.type_._0_8_ =
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)0x0;
    if (_Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl != (Expression *)0x0)
    {
      (**(code **)(*(long *)_Var7.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl +
                  8))();
    }
    if ((PhysicalOperator *)local_148.type_._0_8_ != (PhysicalOperator *)0x0) {
      (*((BaseExpression *)local_148.type_._0_8_)->_vptr_BaseExpression[1])();
    }
    pLVar3 = (pLVar10->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pLVar4 = (pLVar10->types).
             super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
             super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
             super__Vector_impl_data._M_start;
    this_02 = (BoundReferenceExpression *)operator_new(0x60);
    LogicalType::LogicalType(&local_148.type_,&local_60);
    BoundReferenceExpression::BoundReferenceExpression
              (this_02,&local_148.type_,((long)pLVar3 - (long)pLVar4 >> 3) * -0x5555555555555555 - 1
              );
    LogicalType::~LogicalType(&local_148.type_);
    if (pBStack_f0 != (BoundReferenceExpression *)0x0) {
      uVar6 = &pBStack_f0->super_Expression;
      pBStack_f0 = this_02;
      (**(code **)(*(long *)uVar6 + 8))();
      this_02 = pBStack_f0;
    }
    pBStack_f0 = this_02;
    if (3 < (byte)(local_d8->comparison - COMPARE_LESSTHAN)) {
      pIVar19 = (InternalException *)__cxa_allocate_exception(0x10);
      local_148.type_._0_8_ =
           &local_148.type_.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Invalid ASOF JOIN comparison for IEJoin","");
      InternalException::InternalException(pIVar19,(string *)&local_148);
      __cxa_throw(pIVar19,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    local_e8 = '9' - local_d8->comparison;
    ::std::vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>::
    emplace_back<duckdb::JoinCondition>
              (&local_100->
                super_vector<duckdb::JoinCondition,_std::allocator<duckdb::JoinCondition>_>,
               (JoinCondition *)&local_f8);
    pPVar17 = unique_ptr<duckdb::PhysicalPlan,_std::default_delete<duckdb::PhysicalPlan>,_true>::
              operator->(this_03);
    _Var18._M_head_impl =
         (Expression *)
         PhysicalPlan::
         Make<duckdb::PhysicalIEJoin,duckdb::LogicalComparisonJoin&,duckdb::PhysicalOperator&,duckdb::PhysicalOperator&,duckdb::vector<duckdb::JoinCondition,true>,duckdb::JoinType&,unsigned_long&>
                   (pPVar17,args,local_d0,args_2,local_100,
                    &(args->super_LogicalJoin).super_LogicalOperator.field_0x61,&local_68);
    if (pBStack_f0 != (BoundReferenceExpression *)0x0) {
      (*(pBStack_f0->super_Expression).super_BaseExpression._vptr_BaseExpression[1])();
    }
    pBStack_f0 = (BoundReferenceExpression *)0x0;
    if (local_f8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl !=
        (Expression *)0x0) {
      (**(code **)(*(long *)local_f8.super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl
                  + 8))();
    }
    ::std::
    vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
    ::~vector((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
               *)&local_c8);
    if (local_150._M_head_impl != (BoundWindowExpression *)0x0) {
      (*((local_150._M_head_impl)->super_Expression).super_BaseExpression._vptr_BaseExpression[1])()
      ;
    }
    LogicalType::~LogicalType(&local_60);
  }
  if (local_88 != (size_type *)0x0) {
    operator_delete(local_88);
  }
  return (PhysicalOperator *)(_Head_base<0UL,_duckdb::Expression_*,_false>)_Var18._M_head_impl;
}

Assistant:

PhysicalOperator &PhysicalPlanGenerator::PlanAsOfJoin(LogicalComparisonJoin &op) {
	// now visit the children
	D_ASSERT(op.children.size() == 2);
	idx_t lhs_cardinality = op.children[0]->EstimateCardinality(context);
	idx_t rhs_cardinality = op.children[1]->EstimateCardinality(context);
	auto &left = CreatePlan(*op.children[0]);
	auto &right = CreatePlan(*op.children[1]);

	//	Validate
	vector<idx_t> equi_indexes;
	auto asof_idx = op.conditions.size();
	for (size_t c = 0; c < op.conditions.size(); ++c) {
		auto &cond = op.conditions[c];
		switch (cond.comparison) {
		case ExpressionType::COMPARE_EQUAL:
		case ExpressionType::COMPARE_NOT_DISTINCT_FROM:
			equi_indexes.emplace_back(c);
			break;
		case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		case ExpressionType::COMPARE_GREATERTHAN:
		case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		case ExpressionType::COMPARE_LESSTHAN:
			D_ASSERT(asof_idx == op.conditions.size());
			asof_idx = c;
			break;
		default:
			throw InternalException("Invalid ASOF JOIN comparison");
		}
	}
	D_ASSERT(asof_idx < op.conditions.size());

	auto &config = ClientConfig::GetConfig(context);
	if (!config.force_asof_iejoin) {
		if (op.children[0]->has_estimated_cardinality && lhs_cardinality <= config.asof_loop_join_threshold) {
			auto result = PlanAsOfLoopJoin(op, left, right);
			if (result) {
				return *result;
			}
		}
		return Make<PhysicalAsOfJoin>(op, left, right);
	}

	//	Strip extra column from rhs projections
	auto &right_projection_map = op.right_projection_map;
	if (right_projection_map.empty()) {
		const auto right_count = right.GetTypes().size();
		right_projection_map.reserve(right_count);
		for (column_t i = 0; i < right_count; ++i) {
			right_projection_map.emplace_back(i);
		}
	}

	//	Debug implementation: IEJoin of Window
	//	LEAD(asof_column, 1, infinity) OVER (PARTITION BY equi_column... ORDER BY asof_column) AS asof_end
	auto &asof_comp = op.conditions[asof_idx];
	auto &asof_column = asof_comp.right;
	auto asof_type = asof_column->return_type;
	auto asof_end = make_uniq<BoundWindowExpression>(ExpressionType::WINDOW_LEAD, asof_type, nullptr, nullptr);
	asof_end->children.emplace_back(asof_column->Copy());
	// TODO: If infinities are not supported for a type, fake them by looking at LHS statistics?
	asof_end->offset_expr = make_uniq<BoundConstantExpression>(Value::BIGINT(1));
	for (auto equi_idx : equi_indexes) {
		asof_end->partitions.emplace_back(op.conditions[equi_idx].right->Copy());
	}
	switch (asof_comp.comparison) {
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
	case ExpressionType::COMPARE_GREATERTHAN:
		asof_end->orders.emplace_back(OrderType::ASCENDING, OrderByNullType::NULLS_FIRST, asof_column->Copy());
		asof_end->default_expr = make_uniq<BoundConstantExpression>(Value::Infinity(asof_type));
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
	case ExpressionType::COMPARE_LESSTHAN:
		asof_end->orders.emplace_back(OrderType::DESCENDING, OrderByNullType::NULLS_FIRST, asof_column->Copy());
		asof_end->default_expr = make_uniq<BoundConstantExpression>(Value::NegativeInfinity(asof_type));
		break;
	default:
		throw InternalException("Invalid ASOF JOIN ordering for WINDOW");
	}

	asof_end->start = WindowBoundary::UNBOUNDED_PRECEDING;
	asof_end->end = WindowBoundary::CURRENT_ROW_ROWS;

	vector<unique_ptr<Expression>> window_select;
	window_select.emplace_back(std::move(asof_end));

	auto &window_types = op.children[1]->types;
	window_types.emplace_back(asof_type);

	auto &window = Make<PhysicalWindow>(window_types, std::move(window_select), rhs_cardinality);
	window.children.emplace_back(right);

	// IEJoin(left, window, conditions || asof_comp ~op asof_end)
	JoinCondition asof_upper;
	asof_upper.left = asof_comp.left->Copy();
	asof_upper.right = make_uniq<BoundReferenceExpression>(asof_type, window_types.size() - 1);
	switch (asof_comp.comparison) {
	case ExpressionType::COMPARE_GREATERTHANOREQUALTO:
		asof_upper.comparison = ExpressionType::COMPARE_LESSTHAN;
		break;
	case ExpressionType::COMPARE_GREATERTHAN:
		asof_upper.comparison = ExpressionType::COMPARE_LESSTHANOREQUALTO;
		break;
	case ExpressionType::COMPARE_LESSTHANOREQUALTO:
		asof_upper.comparison = ExpressionType::COMPARE_GREATERTHAN;
		break;
	case ExpressionType::COMPARE_LESSTHAN:
		asof_upper.comparison = ExpressionType::COMPARE_GREATERTHANOREQUALTO;
		break;
	default:
		throw InternalException("Invalid ASOF JOIN comparison for IEJoin");
	}

	op.conditions.emplace_back(std::move(asof_upper));
	return Make<PhysicalIEJoin>(op, left, window, std::move(op.conditions), op.join_type, lhs_cardinality);
}